

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cpp
# Opt level: O2

void __thiscall create::Serial::onData(Serial *this,error_code *e,size_t *size)

{
  ostream *poVar1;
  _Bind<void_(create::Serial::*(std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_boost::system::error_code_&,_const_unsigned_long_&)>
  local_68;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  mutable_buffers_1 local_30;
  
  if (e->failed_ == true) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"[create::Serial] ");
    poVar1 = std::operator<<(poVar1,"serial error - ");
    (*e->cat_->_vptr_error_category[4])(&local_68,e->cat_,(ulong)(uint)e->val_);
    poVar1 = std::operator<<(poVar1,(string *)&local_68);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    if (*size == 1) {
      (*this->_vptr_Serial[1])(this,(ulong)this->byteRead);
    }
    local_30.super_mutable_buffer.data_ = &this->byteRead;
    local_30.super_mutable_buffer.size_ = 1;
    std::__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<create::Serial,void>
              ((__shared_ptr<create::Serial,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<create::Serial>);
    local_68._M_f = (offset_in_Serial_to_subr)onData;
    local_68._8_8_ = 0;
    local_68._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
    super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
    local_68._M_bound_args.
    super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
    .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
    super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_40[0]._M_pi;
    local_48 = (element_type *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    boost::asio::
    async_read<boost::asio::basic_serial_port<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1,std::_Bind<void(create::Serial::*(std::shared_ptr<create::Serial>,std::_Placeholder<1>,std::_Placeholder<2>))(boost::system::error_code_const&,unsigned_long_const&)>>
              (&this->port,&local_30,&local_68,(type *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_68._M_bound_args.
                super__Tuple_impl<0UL,_std::shared_ptr<create::Serial>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                .super__Head_base<0UL,_std::shared_ptr<create::Serial>,_false>._M_head_impl.
                super___shared_ptr<create::Serial,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  return;
}

Assistant:

void Serial::onData(const boost::system::error_code& e, const std::size_t& size) {
    if (e) {
      CERR("[create::Serial] ", "serial error - " << e.message());
      return;
    }

    // Should have read exactly one byte
    if (size == 1) {
      processByte(byteRead);
    } // end if (size == 1)

    // Read the next byte
    boost::asio::async_read(port,
                            boost::asio::buffer(&byteRead, 1),
                            std::bind(&Serial::onData,
                                      shared_from_this(),
                                      std::placeholders::_1,
                                      std::placeholders::_2));
  }